

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawListFlags IVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ImDrawList *pIVar5;
  ImDrawCmd *pIVar6;
  ImDrawVert *pIVar7;
  ImVector<unsigned_short> *lhs;
  float fVar8;
  char *local_3f0;
  uint local_3cc;
  ImVec2 *local_3b0;
  uint local_3a4;
  ImVec2 *local_388;
  uint local_364;
  ImVec2 *local_348;
  float local_32c;
  long local_318;
  char *local_2f0;
  ImDrawListFlags backup_flags_1;
  ImDrawVert *local_2c8;
  ImDrawVert *v;
  int n_2;
  ImVec2 triangle_2 [3];
  char *buf_end;
  char *buf_p;
  int local_288;
  int idx_i;
  int prim;
  undefined1 local_274 [8];
  ImGuiListClipper clipper;
  int n_1;
  ImVec2 triangle_1 [3];
  ImVec2 IStack_238;
  uint base_idx_1;
  ImVec2 local_230;
  undefined1 local_228 [8];
  ImRect clip_rect_1;
  ImDrawListFlags backup_flags;
  int local_20c;
  int n;
  ImVec2 triangle [3];
  float local_1e8;
  float local_1e4;
  uint base_idx;
  float total_area;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  ImVec2 local_1c8;
  float local_1c0;
  undefined1 local_1bc [4];
  uint i;
  ImRect vtxs_rect;
  ImRect clip_rect;
  bool pcmd_node_open;
  char buf [300];
  ImDrawIdx *idx_buffer;
  ImDrawCmd *pcmd;
  ImVec2 IStack_48;
  uint elem_offset;
  ImDrawList *local_40;
  ImDrawList *fg_draw_list;
  byte local_21;
  char *pcStack_20;
  bool node_open;
  char *label_local;
  ImDrawList *draw_list_local;
  ImGuiWindow *window_local;
  
  if (draw_list->_OwnerName == (char *)0x0) {
    local_2f0 = "";
  }
  else {
    local_2f0 = draw_list->_OwnerName;
  }
  pcStack_20 = label;
  label_local = (char *)draw_list;
  draw_list_local = (ImDrawList *)window;
  local_21 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,local_2f0,
                      (ulong)(uint)(draw_list->VtxBuffer).Size,
                      (ulong)(uint)(draw_list->IdxBuffer).Size,(draw_list->CmdBuffer).Size);
  pcVar2 = label_local;
  pIVar5 = GetWindowDrawList();
  if ((ImDrawList *)pcVar2 == pIVar5) {
    SameLine(0.0,-1.0);
    ImVec4::ImVec4((ImVec4 *)((long)&fg_draw_list + 4),1.0,0.4,0.4,1.0);
    TextColored((ImVec4 *)((long)&fg_draw_list + 4),"CURRENTLY APPENDING");
    if ((local_21 & 1) != 0) {
      TreePop();
    }
  }
  else {
    local_40 = GetForegroundDrawList((ImGuiWindow *)draw_list_local);
    if ((draw_list_local != (ImDrawList *)0x0) &&
       (bVar3 = IsItemHovered(0), pIVar5 = local_40, bVar3)) {
      lhs = &draw_list_local->IdxBuffer;
      IStack_48 = ::operator+((ImVec2 *)lhs,(ImVec2 *)&(draw_list_local->IdxBuffer).Data);
      ImDrawList::AddRect(pIVar5,(ImVec2 *)lhs,&stack0xffffffffffffffb8,0xff00ffff,0.0,0xf,1.0);
    }
    if ((local_21 & 1) != 0) {
      if ((draw_list_local != (ImDrawList *)0x0) &&
         (((ulong)(draw_list_local->_TextureIdStack).Data & 0x100000000000000) == 0)) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
      pcmd._4_4_ = 0.0;
      for (idx_buffer = (ImDrawIdx *)ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
          pIVar6 = ImVector<ImDrawCmd>::end((ImVector<ImDrawCmd> *)label_local), idx_buffer < pIVar6
          ; idx_buffer = idx_buffer + 0x1c) {
        if ((*(long *)(idx_buffer + 0x14) != 0) || (*(int *)idx_buffer != 0)) {
          if (*(long *)(idx_buffer + 0x14) == 0) {
            if (*(int *)(label_local + 0x10) < 1) {
              local_318 = 0;
            }
            else {
              local_318 = *(long *)(label_local + 0x18);
            }
            ImFormatString((char *)&clip_rect.Max.y,300,
                           "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           (double)*(float *)(idx_buffer + 2),(double)*(float *)(idx_buffer + 4),
                           (double)*(float *)(idx_buffer + 6),(double)*(float *)(idx_buffer + 8),
                           (ulong)*(uint *)idx_buffer / 3,*(undefined8 *)(idx_buffer + 0xc));
            pIVar6 = ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
            clip_rect.Max.x._3_1_ =
                 TreeNode((void *)(((long)idx_buffer - (long)pIVar6) / 0x38),"%s",&clip_rect.Max.y);
            if ((((show_drawcmd_details & 1U) != 0) && (local_40 != (ImDrawList *)0x0)) &&
               (bVar3 = IsItemHovered(0), bVar3)) {
              ImRect::ImRect((ImRect *)&vtxs_rect.Max,(ImVec4 *)(idx_buffer + 2));
              ImRect::ImRect((ImRect *)local_1bc,3.4028235e+38,3.4028235e+38,-3.4028235e+38,
                             -3.4028235e+38);
              for (local_1c0 = pcmd._4_4_; pIVar5 = local_40,
                  (uint)local_1c0 < (uint)((int)pcmd._4_4_ + *(int *)idx_buffer);
                  local_1c0 = (float)((int)local_1c0 + 1)) {
                if (local_318 == 0) {
                  local_32c = local_1c0;
                }
                else {
                  local_32c = (float)(uint)*(ushort *)(local_318 + (ulong)(uint)local_1c0 * 2);
                }
                pIVar7 = ImVector<ImDrawVert>::operator[]
                                   ((ImVector<ImDrawVert> *)(label_local + 0x20),(int)local_32c);
                ImRect::Add((ImRect *)local_1bc,&pIVar7->pos);
              }
              local_1c8 = ImFloor(&vtxs_rect.Max);
              local_1d0 = ImFloor(&clip_rect.Min);
              ImDrawList::AddRect(pIVar5,&local_1c8,&local_1d0,0xffff00ff,0.0,0xf,1.0);
              pIVar5 = local_40;
              local_1d8 = ImFloor((ImVec2 *)local_1bc);
              _base_idx = ImFloor(&vtxs_rect.Min);
              ImDrawList::AddRect(pIVar5,&local_1d8,(ImVec2 *)&base_idx,0xff00ffff,0.0,0xf,1.0);
            }
            if ((clip_rect.Max.x._3_1_ & 1) != 0) {
              local_1e4 = 0.0;
              for (local_1e8 = pcmd._4_4_;
                  (uint)local_1e8 < (uint)((int)pcmd._4_4_ + *(int *)idx_buffer);
                  local_1e8 = (float)((int)local_1e8 + 3)) {
                local_348 = (ImVec2 *)&stack0xfffffffffffffdf8;
                do {
                  ImVec2::ImVec2(local_348);
                  local_348 = local_348 + 1;
                } while (local_348 != triangle + 2);
                for (local_20c = 0; local_20c < 3; local_20c = local_20c + 1) {
                  if (local_318 == 0) {
                    local_364 = (int)local_1e8 + local_20c;
                  }
                  else {
                    local_364 = (uint)*(ushort *)
                                       (local_318 + (ulong)(uint)((int)local_1e8 + local_20c) * 2);
                  }
                  pIVar7 = ImVector<ImDrawVert>::operator[]
                                     ((ImVector<ImDrawVert> *)(label_local + 0x20),local_364);
                  *(ImVec2 *)(&stack0xfffffffffffffdf8 + (long)local_20c * 8) = pIVar7->pos;
                }
                fVar8 = ImTriangleArea((ImVec2 *)&stack0xfffffffffffffdf8,triangle,triangle + 1);
                local_1e4 = fVar8 + local_1e4;
              }
              ImFormatString((char *)&clip_rect.Max.y,300,
                             "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                             (double)local_1e4,(ulong)*(uint *)idx_buffer,
                             (ulong)*(uint *)(idx_buffer + 0x10),(ulong)*(uint *)(idx_buffer + 0x12)
                            );
              ImVec2::ImVec2((ImVec2 *)&clip_rect_1.Max.y,0.0,0.0);
              Selectable((char *)&clip_rect.Max.y,false,0,(ImVec2 *)&clip_rect_1.Max.y);
              if (((local_40 != (ImDrawList *)0x0) && (bVar3 = IsItemHovered(0), bVar3)) &&
                 ((show_drawcmd_details & 1U) != 0)) {
                clip_rect_1.Max.x = (float)local_40->Flags;
                local_40->Flags = local_40->Flags & 0xfffffffe;
                ImRect::ImRect((ImRect *)local_228,(ImVec4 *)(idx_buffer + 2));
                pIVar5 = local_40;
                local_230 = ImFloor((ImVec2 *)local_228);
                IStack_238 = ImFloor(&clip_rect_1.Min);
                ImDrawList::AddRect(pIVar5,&local_230,&stack0xfffffffffffffdc8,0xffff00ff,0.0,0xf,
                                    1.0);
                for (triangle_1[2].y = pcmd._4_4_;
                    (uint)triangle_1[2].y < (uint)((int)pcmd._4_4_ + *(int *)idx_buffer);
                    triangle_1[2].y = (float)((int)triangle_1[2].y + 3)) {
                  local_388 = (ImVec2 *)&clipper.StartPosY;
                  do {
                    ImVec2::ImVec2(local_388);
                    local_388 = local_388 + 1;
                  } while (local_388 != triangle_1 + 2);
                  for (clipper.ItemsHeight = 0.0; (int)clipper.ItemsHeight < 3;
                      clipper.ItemsHeight = (float)((int)clipper.ItemsHeight + 1)) {
                    if (local_318 == 0) {
                      local_3a4 = (int)triangle_1[2].y + (int)clipper.ItemsHeight;
                    }
                    else {
                      local_3a4 = (uint)*(ushort *)
                                         (local_318 +
                                         (ulong)(uint)((int)triangle_1[2].y +
                                                      (int)clipper.ItemsHeight) * 2);
                    }
                    pIVar7 = ImVector<ImDrawVert>::operator[]
                                       ((ImVector<ImDrawVert> *)(label_local + 0x20),local_3a4);
                    *(ImVec2 *)(&clipper.StartPosY + (long)(int)clipper.ItemsHeight * 2) =
                         pIVar7->pos;
                  }
                  ImDrawList::AddPolyline
                            (local_40,(ImVec2 *)&clipper.StartPosY,3,0xff00ffff,true,1.0);
                }
                local_40->Flags = (ImDrawListFlags)clip_rect_1.Max.x;
              }
              ImGuiListClipper::ImGuiListClipper
                        ((ImGuiListClipper *)local_274,*(uint *)idx_buffer / 3,-1.0);
              while (bVar3 = ImGuiListClipper::Step((ImGuiListClipper *)local_274), bVar3) {
                buf_p._4_4_ = (int)pcmd._4_4_ + local_274._0_4_ * 3;
                for (local_288 = local_274._0_4_; local_288 < (int)local_274._4_4_;
                    local_288 = local_288 + 1) {
                  buf_end = (char *)&clip_rect.Max.y;
                  triangle_2[2] = (ImVec2)((long)buf + 0x124);
                  local_3b0 = (ImVec2 *)&stack0xfffffffffffffd48;
                  do {
                    ImVec2::ImVec2(local_3b0);
                    local_3b0 = local_3b0 + 1;
                  } while (local_3b0 != triangle_2 + 2);
                  for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
                    if (local_318 == 0) {
                      local_3cc = buf_p._4_4_;
                    }
                    else {
                      local_3cc = (uint)*(ushort *)(local_318 + (long)(int)buf_p._4_4_ * 2);
                    }
                    local_2c8 = ImVector<ImDrawVert>::operator[]
                                          ((ImVector<ImDrawVert> *)(label_local + 0x20),local_3cc);
                    *(ImVec2 *)(&stack0xfffffffffffffd48 + (long)v._4_4_ * 8) = local_2c8->pos;
                    if (v._4_4_ == 0) {
                      local_3f0 = "Vert:";
                    }
                    else {
                      local_3f0 = "     ";
                    }
                    iVar4 = ImFormatString(buf_end,(long)triangle_2[2] - (long)buf_end,
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           (double)(local_2c8->pos).x,(double)(local_2c8->pos).y,
                                           (double)(local_2c8->uv).x,(double)(local_2c8->uv).y,
                                           local_3f0,(ulong)buf_p._4_4_,(ulong)local_2c8->col);
                    buf_end = buf_end + iVar4;
                    buf_p._4_4_ = buf_p._4_4_ + 1;
                  }
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd30,0.0,0.0);
                  Selectable((char *)&clip_rect.Max.y,false,0,(ImVec2 *)&stack0xfffffffffffffd30);
                  if ((local_40 != (ImDrawList *)0x0) && (bVar3 = IsItemHovered(0), bVar3)) {
                    IVar1 = local_40->Flags;
                    local_40->Flags = local_40->Flags & 0xfffffffe;
                    ImDrawList::AddPolyline
                              (local_40,(ImVec2 *)&stack0xfffffffffffffd48,3,0xff00ffff,true,1.0);
                    local_40->Flags = IVar1;
                  }
                }
              }
              TreePop();
              ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_274);
            }
          }
          else {
            BulletText("Callback %p, user_data %p",*(undefined8 *)(idx_buffer + 0x14),
                       *(undefined8 *)(idx_buffer + 0x18));
          }
        }
        pcmd._4_4_ = (float)(*(int *)idx_buffer + (int)pcmd._4_4_);
      }
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_details && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
                    for (unsigned int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255,0,255,255));
                    fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (fg_draw_list && ImGui::IsItemHovered() && show_drawcmd_details)
                {
                    // Draw wire-frame version of everything
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    ImRect clip_rect = pcmd->ClipRect;
                    fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255));
                    for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                    {
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++)
                            triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                        fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    }
                    fg_draw_list->Flags = backup_flags;
                }

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }